

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QPixmapStyle::ControlPixmap,QPixmapStylePixmap>::
tryEmplace_impl<QPixmapStyle::ControlPixmap_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,ControlPixmap *key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *pDVar3;
  ulong uVar4;
  Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *pNVar6;
  uint uVar8;
  long in_FS_OFFSET;
  Bucket BVar9;
  Bucket BVar10;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *this;
  if (pDVar3 == (Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *)0x0) {
    pDVar3 = QHashPrivate::
             Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::detached
                       ((Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>
                         *)0x0);
    *(Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> **)this = pDVar3;
  }
  local_40.d = (Data *)0x0;
  uVar4 = (pDVar3->seed >> 0x20 ^ (ulong)*key ^ pDVar3->seed) * -0x2917014799a6026d;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  uVar4 = uVar4 >> 0x20 ^ uVar4;
  BVar9 = QHashPrivate::Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
          findBucketWithHash<QPixmapStyle::ControlPixmap>(pDVar3,key,uVar4);
  uVar7 = BVar9.index;
  pSVar5 = BVar9.span;
  uVar1 = pSVar5->offsets[uVar7];
  pDVar3 = *this;
  if ((pDVar3 == (Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> *)0x0)
     || (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::operator=
              (&local_40,(QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)this);
    if (uVar1 == 0xff) {
LAB_00346c96:
      pDVar3 = *this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::
                 Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
                 detached(pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> **)this =
             pDVar3;
        BVar10 = QHashPrivate::
                 Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::
                 findBucketWithHash<QPixmapStyle::ControlPixmap>(pDVar3,key,uVar4);
        goto LAB_00346d09;
      }
    }
    else {
      pDVar3 = *this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::
             Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>::detached
                       (pDVar3);
    *(Data<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_> **)this = pDVar3;
    uVar8 = (uint)BVar9.index & 0x7f;
    BVar10.index._0_4_ = uVar8;
    BVar10.span = pDVar3->spans +
                  ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar10.index._4_4_ = 0;
    BVar9.index._0_4_ = uVar8;
    BVar9.span = pDVar3->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar9.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_00346d4a;
  }
  else {
    if (uVar1 != 0xff) goto LAB_00346d4a;
    BVar10 = BVar9;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::operator=
                (&local_40,(QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)this);
      goto LAB_00346c96;
    }
  }
LAB_00346d09:
  BVar9 = BVar10;
  pNVar6 = QHashPrivate::Span<QHashPrivate::Node<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>_>
           ::insert(BVar9.span,BVar9.index);
  pNVar6->key = *key;
  *(undefined8 *)&(pNVar6->value).field_0x10 = 0;
  (pNVar6->value).margins.m_left = 0;
  (pNVar6->value).margins.m_top = 0;
  *(undefined8 *)&pNVar6->value = 0;
  *(undefined8 *)&(pNVar6->value).field_0x8 = 0;
  (pNVar6->value).margins.m_right = 0;
  (pNVar6->value).margins.m_bottom = 0;
  QPixmap::QPixmap(&(pNVar6->value).pixmap);
  (pNVar6->value).margins.m_left = 0;
  (pNVar6->value).margins.m_top = 0;
  (pNVar6->value).margins.m_right = 0;
  (pNVar6->value).margins.m_bottom = 0;
  pDVar3 = *this;
  pDVar3->size = pDVar3->size + 1;
LAB_00346d4a:
  pSVar5 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar9.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar9.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }